

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O3

bool __thiscall CheckStructure::isType(CheckStructure *this,string *begin)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_t __n;
  _Alloc_hider _Var4;
  CheckStructure *pCVar5;
  int iVar6;
  pointer pbVar7;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  CheckStructure *local_38;
  
  this->m_coutTypes = this->m_coutTypes + 1;
  pbVar7 = (this->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pbVar7 != pbVar2) {
    paVar1 = &local_58.field_2;
    do {
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + pbVar7->_M_string_length);
      _Var4._M_p = local_58._M_dataplus._M_p;
      __n = begin->_M_string_length;
      if ((__n == local_58._M_string_length) &&
         ((__n == 0 ||
          (iVar6 = bcmp((begin->_M_dataplus)._M_p,local_58._M_dataplus._M_p,__n), iVar6 == 0)))) {
        if (local_38->m_coutTypes == 1) {
          std::__cxx11::string::_M_assign((string *)local_38);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        return true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != paVar1) {
        operator_delete(_Var4._M_p);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  iVar6 = std::__cxx11::string::compare((char *)begin);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (iVar6 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"missed type of main()","");
    pCVar5 = local_38;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_38->m_errors,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pCVar5->m_countCalls = pCVar5->m_countCalls + 1;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Wrong type of main()","");
    pCVar5 = local_38;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_38->m_errors,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pCVar5->m_fWrongType = true;
  }
  return false;
}

Assistant:

bool CheckStructure::isType(string begin) {
    m_coutTypes++;
    for (string str : types) {
        if (begin == str) {
            if (m_coutTypes == 1)
                m_sMainType = str;
            return true;
        }
    }
    if (begin == "main") {
        m_errors.push_back("missed type of main()");
        m_countCalls++;
        return false;
    } else {
        m_errors.push_back("Wrong type of main()");
        m_fWrongType = true;
    }
    return false;
}